

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  istream *input_stream;
  char *pcVar8;
  bool bVar9;
  int vector_length;
  int codebook_index;
  allocator local_5f5;
  int index;
  string local_5f0;
  vector<double,_std::allocator<double>_> input_vector;
  ifstream ifs2;
  byte abStack_598 [488];
  ifstream ifs1;
  byte abStack_390 [488];
  ostringstream error_message_6;
  
  vector_length = 0x1a;
  codebook_index = 0;
LAB_00102594:
  do {
    iVar5 = ya_getopt_long(argc,argv,"l:m:i:h",(option *)0x0,(int *)0x0);
    switch(iVar5) {
    case 0x68:
      anon_unknown.dwarf_2adf::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs1,&codebook_index);
      bVar9 = codebook_index < 0;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar3 || bVar9) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        poVar7 = std::operator<<((ostream *)&ifs1,"The argument for the -i option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::__cxx11::string::string((string *)&ifs2,"extract",(allocator *)&error_message_6);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_00102948;
      }
      break;
    case 0x6c:
      goto switchD_001025bd_caseD_6c;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs1,&vector_length);
      bVar9 = vector_length < 0;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar3 || bVar9) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        poVar7 = std::operator<<((ostream *)&ifs1,"The argument for the -m option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::__cxx11::string::string((string *)&ifs2,"extract",(allocator *)&error_message_6);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_00102948;
      }
      vector_length = vector_length + 1;
      break;
    default:
      if (iVar5 == -1) {
        lVar6 = (long)argc;
        if (argc - ya_optind == 1) {
          lVar2 = lVar6 + -1;
          pcVar8 = (char *)0x0;
        }
        else {
          if (argc - ya_optind != 2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
            std::operator<<((ostream *)&ifs1,
                            "Just two input files, idxfile and infile, are required");
            std::__cxx11::string::string((string *)&ifs2,"extract",(allocator *)&error_message_6);
            sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
            goto LAB_00102948;
          }
          lVar2 = lVar6 + -2;
          pcVar8 = argv[lVar6 + -1];
        }
        pcVar1 = argv[lVar2];
        bVar3 = sptk::SetBinaryMode();
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
          std::operator<<((ostream *)&ifs1,"Cannot set translation mode");
          std::__cxx11::string::string((string *)&ifs2,"extract",(allocator *)&error_message_6);
          sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
          goto LAB_00102948;
        }
        std::ifstream::ifstream(&ifs1);
        std::ifstream::open((char *)&ifs1,(_Ios_Openmode)pcVar1);
        if ((abStack_390[*(long *)(_ifs1 + -0x18)] & 5) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs2);
          poVar7 = std::operator<<((ostream *)&ifs2,"Cannot open file ");
          std::operator<<(poVar7,pcVar1);
          std::__cxx11::string::string((string *)&error_message_6,"extract",(allocator *)&local_5f0)
          ;
          sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs2);
          std::__cxx11::string::~string((string *)&error_message_6);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs2);
          iVar5 = 1;
          goto LAB_00102b37;
        }
        input_stream = (istream *)&ifs2;
        std::ifstream::ifstream(input_stream);
        if ((pcVar8 != (char *)0x0) &&
           (std::ifstream::open((char *)&ifs2,(_Ios_Openmode)pcVar8),
           (abStack_598[*(long *)(_ifs2 + -0x18)] & 5) != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
          poVar7 = std::operator<<((ostream *)&error_message_6,"Cannot open file ");
          std::operator<<(poVar7,pcVar8);
          std::__cxx11::string::string((string *)&local_5f0,"extract",(allocator *)&input_vector);
          sptk::PrintErrorMessage(&local_5f0,&error_message_6);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
          iVar5 = 1;
          goto LAB_00102b2d;
        }
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') {
          input_stream = (istream *)&std::cin;
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&input_vector,(long)vector_length,(allocator_type *)&error_message_6);
        iVar5 = 0;
        goto LAB_00102a69;
      }
    case 0x6a:
    case 0x6b:
      anon_unknown.dwarf_2adf::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
  } while( true );
switchD_001025bd_caseD_6c:
  std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
  bVar9 = sptk::ConvertStringToInteger((string *)&ifs1,&vector_length);
  bVar3 = vector_length < 1;
  std::__cxx11::string::~string((string *)&ifs1);
  if (!bVar9 || bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
    std::operator<<((ostream *)&ifs1,"The argument for the -l option must be a positive integer");
    std::__cxx11::string::string((string *)&ifs2,"extract",(allocator *)&error_message_6);
    sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
LAB_00102948:
    std::__cxx11::string::~string((string *)&ifs2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs1);
    return 1;
  }
  goto LAB_00102594;
LAB_00102a69:
  do {
    bVar3 = sptk::ReadStream<int>(&index,(istream *)&ifs1);
    if ((!bVar3) ||
       (bVar3 = sptk::ReadStream<double>
                          (false,0,0,vector_length,&input_vector,input_stream,(int *)0x0), !bVar3))
    goto LAB_00102b23;
  } while ((index != codebook_index) ||
          (bVar3 = sptk::WriteStream<double>
                             (0,vector_length,&input_vector,(ostream *)&std::cout,(int *)0x0), bVar3
          ));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
  std::operator<<((ostream *)&error_message_6,"Failed to write extracted vector");
  std::__cxx11::string::string((string *)&local_5f0,"extract",&local_5f5);
  sptk::PrintErrorMessage(&local_5f0,&error_message_6);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
  iVar5 = 1;
LAB_00102b23:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input_vector.super__Vector_base<double,_std::allocator<double>_>);
LAB_00102b2d:
  std::ifstream::~ifstream(&ifs2);
LAB_00102b37:
  std::ifstream::~ifstream(&ifs1);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int codebook_index(kDefaultCodebookIndex);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:i:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("extract", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("extract", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &codebook_index) ||
            codebook_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("extract", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* index_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    index_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    index_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, idxfile and infile, are required";
    sptk::PrintErrorMessage("extract", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("extract", error_message);
    return 1;
  }

  // Open stream for reading index sequence.
  std::ifstream ifs1;
  ifs1.open(index_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << index_file;
    sptk::PrintErrorMessage("extract", error_message);
    return 1;
  }
  std::istream& stream_for_index(ifs1);

  // Open stream for reading input sequence.
  std::ifstream ifs2;
  if (NULL != input_file) {
    ifs2.open(input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("extract", error_message);
      return 1;
    }
  }
  std::istream& stream_for_input(ifs2.is_open() ? ifs2 : std::cin);

  int index;
  std::vector<double> input_vector(vector_length);

  while (sptk::ReadStream(&index, &stream_for_index) &&
         sptk::ReadStream(false, 0, 0, vector_length, &input_vector,
                          &stream_for_input, NULL)) {
    if (index == codebook_index) {
      if (!sptk::WriteStream(0, vector_length, input_vector, &std::cout,
                             NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write extracted vector";
        sptk::PrintErrorMessage("extract", error_message);
        return 1;
      }
    }
  }

  return 0;
}